

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

time_t isodate17(uchar *v)

{
  int iVar1;
  time_t t;
  undefined1 local_50 [4];
  int offset;
  tm_conflict tm;
  uchar *v_local;
  
  tm.tm_zone = (char *)v;
  memset(local_50,0,0x38);
  tm.tm_mday = ((byte)*tm.tm_zone - 0x30) * 1000 + ((byte)tm.tm_zone[1] - 0x30) * 100 +
               ((byte)tm.tm_zone[2] - 0x30) * 10 + (uint)(byte)tm.tm_zone[3] + -0x79c;
  tm.tm_hour = ((byte)tm.tm_zone[4] - 0x30) * 10 + (uint)(byte)tm.tm_zone[5] + -0x31;
  tm.tm_min = ((byte)tm.tm_zone[6] - 0x30) * 10 + ((byte)tm.tm_zone[7] - 0x30);
  tm.tm_sec = ((byte)tm.tm_zone[8] - 0x30) * 10 + ((byte)tm.tm_zone[9] - 0x30);
  offset = ((byte)tm.tm_zone[10] - 0x30) * 10 + ((byte)tm.tm_zone[0xb] - 0x30);
  local_50 = (undefined1  [4])(((byte)tm.tm_zone[0xc] - 0x30) * 10 + ((byte)tm.tm_zone[0xd] - 0x30))
  ;
  iVar1 = (int)tm.tm_zone[0x10];
  if ((-0x30 < iVar1) && (iVar1 < 0x34)) {
    tm.tm_sec = tm.tm_sec - iVar1 / 4;
    offset = offset + (iVar1 % 4) * -0xf;
  }
  v_local = (uchar *)time_from_tm((tm_conflict *)local_50);
  if (v_local == (uchar *)0xffffffffffffffff) {
    v_local = (uchar *)0x0;
  }
  return (time_t)v_local;
}

Assistant:

static time_t
isodate17(const unsigned char *v)
{
	struct tm tm;
	int offset;
	time_t t;

	memset(&tm, 0, sizeof(tm));
	tm.tm_year = (v[0] - '0') * 1000 + (v[1] - '0') * 100
	    + (v[2] - '0') * 10 + (v[3] - '0')
	    - 1900;
	tm.tm_mon = (v[4] - '0') * 10 + (v[5] - '0') - 1;
	tm.tm_mday = (v[6] - '0') * 10 + (v[7] - '0');
	tm.tm_hour = (v[8] - '0') * 10 + (v[9] - '0');
	tm.tm_min = (v[10] - '0') * 10 + (v[11] - '0');
	tm.tm_sec = (v[12] - '0') * 10 + (v[13] - '0');
	/* v[16] is the signed timezone offset, in 1/4-hour increments. */
	offset = ((const signed char *)v)[16];
	if (offset > -48 && offset < 52) {
		tm.tm_hour -= offset / 4;
		tm.tm_min -= (offset % 4) * 15;
	}
	t = time_from_tm(&tm);
	if (t == (time_t)-1)
		return ((time_t)0);
	return (t);
}